

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

int nni_dialer_create_url(nni_dialer **dp,nni_sock *s,nng_url *url)

{
  char *url_00;
  nni_sp_tran *tran_00;
  size_t sz_00;
  nni_dialer *d_00;
  size_t sz;
  int rv;
  nni_dialer *d;
  nni_sp_tran *tran;
  nng_url *url_local;
  nni_sock *s_local;
  nni_dialer **dp_local;
  
  url_00 = nng_url_scheme(url);
  tran_00 = nni_sp_tran_find(url_00);
  if ((tran_00 == (nni_sp_tran *)0x0) || (tran_00->tran_dialer == (nni_sp_dialer_ops *)0x0)) {
    dp_local._4_4_ = 9;
  }
  else {
    sz_00 = tran_00->tran_dialer->d_size + 0x8d0;
    d_00 = (nni_dialer *)nni_zalloc(sz_00);
    if (d_00 == (nni_dialer *)0x0) {
      dp_local._4_4_ = 2;
    }
    else {
      dp_local._4_4_ = nni_url_clone_inline(&d_00->d_url,url);
      if (dp_local._4_4_ == 0) {
        dp_local._4_4_ = nni_dialer_init(d_00,s,tran_00);
        if (dp_local._4_4_ == 0) {
          *dp = d_00;
          dp_local._4_4_ = 0;
        }
        else {
          nni_dialer_destroy(d_00);
        }
      }
      else {
        nni_free(d_00,sz_00);
      }
    }
  }
  return dp_local._4_4_;
}

Assistant:

int
nni_dialer_create_url(nni_dialer **dp, nni_sock *s, const nng_url *url)
{
	nni_sp_tran *tran;
	nni_dialer  *d;
	int          rv;
	size_t       sz;

	if (((tran = nni_sp_tran_find(nng_url_scheme(url))) == NULL) ||
	    (tran->tran_dialer == NULL)) {
		return (NNG_ENOTSUP);
	}
	sz = NNI_ALIGN_UP(sizeof(*d)) + tran->tran_dialer->d_size;
	if ((d = nni_zalloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = nni_url_clone_inline(&d->d_url, url)) != 0) {
		nni_free(d, sz);
		return (rv);
	}
	if ((rv = nni_dialer_init(d, s, tran)) != 0) {
		nni_dialer_destroy(d);
		return (rv);
	}
	*dp = d;
	return (0);
}